

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::Maybe<kj::OwnFd>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveFd(AsyncCapabilityStream *this)

{
  long lVar1;
  ResultHolder *pRVar2;
  void *pvVar3;
  long *in_RSI;
  ResultHolder *ptrCopy;
  SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
  *location;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  anon_class_16_1_6971b95b_for_func local_48;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  pRVar2 = (ResultHolder *)operator_new(8);
  pRVar2->b = '\0';
  *(undefined3 *)&pRVar2->field_0x1 = 0;
  pRVar2->fd = -1;
  (**(code **)(*in_RSI + 0x78))(&promise);
  local_48.result.disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveFd()::ResultHolder>::instance;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
       ::anon_class_16_1_6971b95b_for_func::operator();
  lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
  local_48.result.ptr = pRVar2;
  if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
                *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::AsyncCapabilityStream::tryReceiveFd()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::AsyncCapabilityStream::tryReceiveFd()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_48,
               &continuationTracePtr);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
    location = (SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2646:23)>
                *)((long)promise.super_PromiseBase.node.ptr + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,kj::AsyncCapabilityStream::tryReceiveFd()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::AsyncCapabilityStream::tryReceiveFd()::__0,void*&>
              (location,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,&local_48,
               &continuationTracePtr);
    *(long *)((long)promise.super_PromiseBase.node.ptr + -0x28) = lVar1;
  }
  local_38.ptr = (PromiseNode *)0x0;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)location
  ;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
  if (local_48.result.ptr != (ResultHolder *)0x0) {
    local_48.result.ptr = (ResultHolder *)0x0;
    (**(local_48.result.disposer)->_vptr_Disposer)();
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<OwnFd>> AsyncCapabilityStream::tryReceiveFd() {
  struct ResultHolder {
    byte b;
    OwnFd fd;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithFds(&result->b, 1, 1, &result->fd, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<OwnFd> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a file descriptor (e.g. via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->fd);
  });
}